

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Trim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *p;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint fTrimCos;
  int iVar4;
  uint fDualOut;
  char *pcVar5;
  uint local_44;
  int local_3c;
  
  fDualOut = 0;
  Extra_UtilGetoptReset();
  fTrimCos = 1;
  local_3c = -1;
  local_44 = 1;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar2 = Extra_UtilGetopt(argc,argv,"Viocdh"), iVar4 = globalUtilOptind, iVar2 == 99
                ) {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          if (iVar2 == -1) {
            if (pAbc->pGia != (Gia_Man_t *)0x0) {
              p = Gia_ManDupTrimmed(pAbc->pGia,local_44,fTrimCos,fDualOut,local_3c);
              pNew = p;
              if (bVar1) {
                pNew = Gia_ManDupTrimmed2(p);
                Gia_ManStop(p);
              }
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar3 = "Abc_CommandAbc9Trim(): There is no AIG.\n";
            iVar4 = -1;
            goto LAB_00247edb;
          }
          if (iVar2 != 0x6f) break;
          fTrimCos = fTrimCos ^ 1;
        }
        if (iVar2 != 100) break;
        fDualOut = fDualOut ^ 1;
      }
      if (iVar2 != 0x69) break;
      local_44 = local_44 ^ 1;
    }
    if (iVar2 != 0x56) goto LAB_00247e22;
    if (argc <= globalUtilOptind) break;
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if (local_3c < 0) {
LAB_00247e22:
      iVar4 = -2;
      Abc_Print(-2,"usage: &trim [-V num] [-iocdh]\n");
      Abc_Print(-2,"\t         removes PIs without fanout and PO driven by constants\n");
      Abc_Print(-2,"\t-V num : the value (0 or 1) of POs to remove [default = both]\n");
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (local_44 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle removing PIs [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (fTrimCos == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle removing POs [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle additionally removing POs fed by PIs [default = %s]\n",pcVar3)
      ;
      if (fDualOut == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual-output miter [default = %s]\n",pcVar5);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_00247edb:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
  goto LAB_00247e22;
}

Assistant:

int Abc_CommandAbc9Trim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp, * pTemp2;
    int c;
    int OutValue = -1;
    int fTrimCis = 1;
    int fTrimCos = 1;
    int fDualOut = 0;
    int fPoFedByPi = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Viocdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            OutValue = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( OutValue < 0 )
                goto usage;
            break;
        case 'i':
            fTrimCis ^= 1;
            break;
        case 'o':
            fTrimCos ^= 1;
            break;
        case 'c':
            fPoFedByPi ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Trim(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManDupTrimmed( pAbc->pGia, fTrimCis, fTrimCos, fDualOut, OutValue );
    if ( fPoFedByPi )
    {
        extern Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p );
        pTemp = Gia_ManDupTrimmed2( pTemp2 = pTemp );
        Gia_ManStop( pTemp2 );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &trim [-V num] [-iocdh]\n" );
    Abc_Print( -2, "\t         removes PIs without fanout and PO driven by constants\n" );
    Abc_Print( -2, "\t-V num : the value (0 or 1) of POs to remove [default = both]\n" );
    Abc_Print( -2, "\t-i     : toggle removing PIs [default = %s]\n", fTrimCis? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle removing POs [default = %s]\n", fTrimCos? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle additionally removing POs fed by PIs [default = %s]\n", fPoFedByPi? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}